

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall cmConfigureLog::WriteChecks(cmConfigureLog *this,cmMakefile *mf)

{
  pointer pbVar1;
  StreamWriter *pSVar2;
  cmake *pcVar3;
  ofstream *poVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __tmp;
  pointer value;
  string_view key;
  Value VStack_58;
  
  pcVar3 = cmMakefile::GetCMakeInstance(mf);
  if ((pcVar3->CheckInProgressMessages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pcVar3->CheckInProgressMessages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key._M_str = "checks";
    key._M_len = 6;
    BeginObject(this,key);
    pcVar3 = cmMakefile::GetCMakeInstance(mf);
    pbVar1 = (pcVar3->CheckInProgressMessages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    value = (pcVar3->CheckInProgressMessages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    while (value != pbVar1) {
      value = value + -1;
      poVar4 = BeginLine(this);
      std::operator<<(&poVar4->super_basic_ostream<char,_std::char_traits<char>_>,"- ");
      pSVar2 = (this->Encoder)._M_t.
               super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
               _M_t.
               super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
               .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
      Json::Value::Value(&VStack_58,value);
      (*pSVar2->_vptr_StreamWriter[2])(pSVar2,&VStack_58,&this->Stream);
      Json::Value::~Value(&VStack_58);
      std::endl<char,std::char_traits<char>>
                (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>);
    }
    EndObject(this);
  }
  return;
}

Assistant:

void cmConfigureLog::WriteChecks(cmMakefile const& mf)
{
  if (!mf.GetCMakeInstance()->HasCheckInProgress()) {
    return;
  }
  this->BeginObject("checks"_s);
  for (auto const& value :
       cmReverseRange(mf.GetCMakeInstance()->GetCheckInProgressMessages())) {
    this->BeginLine() << "- ";
    this->Encoder->write(value, &this->Stream);
    this->EndLine();
  }
  this->EndObject();
}